

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

bool woff2::TransformHmtxTable(Font *font)

{
  pointer *ppsVar1;
  bool bVar2;
  Table *pTVar3;
  Table *pTVar4;
  size_type sVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_00;
  reference puVar6;
  reference psVar7;
  uchar *puVar8;
  iterator iStack_198;
  int16_t lsb_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<short,_std::allocator<short>_> *__range2_1;
  iterator iStack_178;
  int16_t lsb_1;
  iterator __end2;
  iterator __begin2;
  vector<short,_std::allocator<short>_> *__range2;
  iterator iStack_158;
  uint16_t advance_width_1;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  size_t transformed_size;
  uint8_t flags;
  mapped_type *pmStack_128;
  Table *transformed_hmtx;
  int16_t lsb;
  uint16_t advance_width;
  size_t glyph_size;
  uint8_t *glyph_data;
  Glyph glyph;
  int i;
  undefined1 local_b8 [8];
  Buffer hmtx_buf;
  undefined1 local_98 [6];
  bool remove_monospace_lsb;
  bool remove_proportional_lsb;
  vector<short,_std::allocator<short>_> monospace_lsbs;
  vector<short,_std::allocator<short>_> proportional_lsbs;
  vector<unsigned_short,_std::allocator<unsigned_short>_> advance_widths;
  int num_glyphs;
  uint16_t num_hmetrics;
  Buffer hhea_buf;
  Table *hhea_table;
  Table *hmtx_table;
  Table *glyf_table;
  Font *font_local;
  
  pTVar3 = Font::FindTable(font,0x676c7966);
  pTVar4 = Font::FindTable(font,0x686d7478);
  hhea_buf.offset_ = (size_t)Font::FindTable(font,0x68686561);
  if ((pTVar4 == (Table *)0x0) || (pTVar3 == (Table *)0x0)) {
    font_local._7_1_ = 1;
  }
  else if ((Table *)hhea_buf.offset_ == (Table *)0x0) {
    font_local._7_1_ = 0;
  }
  else {
    Buffer::Buffer((Buffer *)&num_glyphs,((Table *)hhea_buf.offset_)->data,
                   (ulong)((Table *)hhea_buf.offset_)->length);
    bVar2 = Buffer::Skip((Buffer *)&num_glyphs,0x22);
    if ((bVar2) &&
       (bVar2 = Buffer::ReadU16((Buffer *)&num_glyphs,
                                (uint16_t *)
                                ((long)&advance_widths.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 6)),
       bVar2)) {
      if (advance_widths.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._6_2_ == 0) {
        font_local._7_1_ = 0;
      }
      else {
        advance_widths.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = NumGlyphs(font);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   &proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<short,_std::allocator<short>_>::vector
                  ((vector<short,_std::allocator<short>_> *)
                   &monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<short,_std::allocator<short>_>::vector
                  ((vector<short,_std::allocator<short>_> *)local_98);
        hmtx_buf.offset_._7_1_ = 1;
        hmtx_buf.offset_._6_1_ =
             (int)(uint)advance_widths.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._6_2_ <
             (int)advance_widths.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        Buffer::Buffer((Buffer *)local_b8,pTVar4->data,(ulong)pTVar4->length);
        for (glyph.composite_data_size = 0;
            (int)glyph.composite_data_size <
            (int)advance_widths.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            glyph.composite_data_size = glyph.composite_data_size + 1) {
          Glyph::Glyph((Glyph *)&glyph_data);
          bVar2 = GetGlyphData(font,glyph.composite_data_size,(uint8_t **)&glyph_size,(size_t *)&lsb
                              );
          if ((bVar2) &&
             ((_lsb == 0 ||
              (bVar2 = ReadGlyph((uint8_t *)glyph_size,_lsb,(Glyph *)&glyph_data), bVar2)))) {
            transformed_hmtx._2_2_ = 0;
            transformed_hmtx._0_2_ = 0;
            if ((int)glyph.composite_data_size <
                (int)(uint)advance_widths.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_) {
              bVar2 = Buffer::ReadU16((Buffer *)local_b8,(uint16_t *)((long)&transformed_hmtx + 2));
              if (bVar2) {
                bVar2 = Buffer::ReadS16((Buffer *)local_b8,(int16_t *)&transformed_hmtx);
                if (bVar2) {
                  if ((_lsb != 0) && ((short)glyph_data != (short)transformed_hmtx)) {
                    hmtx_buf.offset_._7_1_ = 0;
                  }
                  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             &proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (value_type_conflict2 *)((long)&transformed_hmtx + 2));
                  std::vector<short,_std::allocator<short>_>::push_back
                            ((vector<short,_std::allocator<short>_> *)
                             &monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (value_type_conflict3 *)&transformed_hmtx);
                  goto LAB_00134451;
                }
                font_local._7_1_ = 0;
                transformed_hmtx._4_4_ = 1;
              }
              else {
                font_local._7_1_ = 0;
                transformed_hmtx._4_4_ = 1;
              }
            }
            else {
              bVar2 = Buffer::ReadS16((Buffer *)local_b8,(int16_t *)&transformed_hmtx);
              if (bVar2) {
                if ((_lsb != 0) && ((short)glyph_data != (short)transformed_hmtx)) {
                  hmtx_buf.offset_._6_1_ = 0;
                }
                std::vector<short,_std::allocator<short>_>::push_back
                          ((vector<short,_std::allocator<short>_> *)local_98,
                           (value_type_conflict3 *)&transformed_hmtx);
LAB_00134451:
                if (((hmtx_buf.offset_._7_1_ & 1) == 0) && ((hmtx_buf.offset_._6_1_ & 1) == 0)) {
                  font_local._7_1_ = 1;
                  transformed_hmtx._4_4_ = 1;
                }
                else {
                  transformed_hmtx._4_4_ = 0;
                }
              }
              else {
                font_local._7_1_ = 0;
                transformed_hmtx._4_4_ = 1;
              }
            }
          }
          else {
            font_local._7_1_ = 0;
            transformed_hmtx._4_4_ = 1;
          }
          Glyph::~Glyph((Glyph *)&glyph_data);
          if (transformed_hmtx._4_4_ != 0) goto LAB_001347c4;
        }
        transformed_size._4_4_ = 0xe8edf4f8;
        pmStack_128 = std::
                      map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                      ::operator[](&font->tables,(key_type *)((long)&transformed_size + 4));
        transformed_size._3_1_ = 0;
        sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        out = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(sVar5 * 2 + 1);
        if ((hmtx_buf.offset_._7_1_ & 1) == 0) {
          sVar5 = std::vector<short,_std::allocator<short>_>::size
                            ((vector<short,_std::allocator<short>_> *)
                             &monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          out = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ((long)&(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start + sVar5 * 2);
        }
        else {
          transformed_size._3_1_ = transformed_size._3_1_ | 1;
        }
        if ((hmtx_buf.offset_._6_1_ & 1) == 0) {
          sVar5 = std::vector<short,_std::allocator<short>_>::size
                            ((vector<short,_std::allocator<short>_> *)local_98);
          out = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ((long)&(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start + sVar5 * 2);
        }
        else {
          transformed_size._3_1_ = transformed_size._3_1_ | 2;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&pmStack_128->buffer,(size_type)out);
        out_00 = &pmStack_128->buffer;
        anon_unknown_2::WriteBytes(out_00,(uint8_t *)((long)&transformed_size + 3),1);
        ppsVar1 = &proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)ppsVar1);
        iStack_158 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)ppsVar1);
        while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffea8), bVar2) {
          puVar6 = __gnu_cxx::
                   __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                   ::operator*(&__end1);
          anon_unknown_2::WriteUShort(out_00,(uint)*puVar6);
          __gnu_cxx::
          __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator++(&__end1);
        }
        if ((hmtx_buf.offset_._7_1_ & 1) == 0) {
          ppsVar1 = &monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          __end2 = std::vector<short,_std::allocator<short>_>::begin
                             ((vector<short,_std::allocator<short>_> *)ppsVar1);
          iStack_178 = std::vector<short,_std::allocator<short>_>::end
                                 ((vector<short,_std::allocator<short>_> *)ppsVar1);
          while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe88), bVar2) {
            psVar7 = __gnu_cxx::
                     __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
                     operator*(&__end2);
            anon_unknown_2::WriteUShort(out_00,(int)*psVar7);
            __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
            operator++(&__end2);
          }
        }
        if ((hmtx_buf.offset_._6_1_ & 1) == 0) {
          __end2_1 = std::vector<short,_std::allocator<short>_>::begin
                               ((vector<short,_std::allocator<short>_> *)local_98);
          iStack_198 = std::vector<short,_std::allocator<short>_>::end
                                 ((vector<short,_std::allocator<short>_> *)local_98);
          while (bVar2 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffe68), bVar2) {
            psVar7 = __gnu_cxx::
                     __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
                     operator*(&__end2_1);
            anon_unknown_2::WriteUShort(out_00,(int)*psVar7);
            __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
            operator++(&__end2_1);
          }
        }
        pmStack_128->tag = 0xe8edf4f8;
        pmStack_128->flag_byte = '@';
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (&pmStack_128->buffer);
        pmStack_128->length = (uint32_t)sVar5;
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           (&pmStack_128->buffer);
        pmStack_128->data = puVar8;
        font_local._7_1_ = 1;
        transformed_hmtx._4_4_ = 1;
LAB_001347c4:
        std::vector<short,_std::allocator<short>_>::~vector
                  ((vector<short,_std::allocator<short>_> *)local_98);
        std::vector<short,_std::allocator<short>_>::~vector
                  ((vector<short,_std::allocator<short>_> *)
                   &monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   &proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      font_local._7_1_ = 0;
    }
  }
  return (bool)(font_local._7_1_ & 1);
}

Assistant:

bool TransformHmtxTable(Font* font) {
  const Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  const Font::Table* hmtx_table = font->FindTable(kHmtxTableTag);
  const Font::Table* hhea_table = font->FindTable(kHheaTableTag);

  // If you don't have hmtx or a glyf not much is going to happen here
  if (hmtx_table == NULL || glyf_table == NULL) {
    return true;
  }

  // hmtx without hhea doesn't make sense
  if (hhea_table == NULL) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Skip 34 to reach 'hhea' numberOfHMetrics
  Buffer hhea_buf(hhea_table->data, hhea_table->length);
  uint16_t num_hmetrics;
  if (!hhea_buf.Skip(34) || !hhea_buf.ReadU16(&num_hmetrics)) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Must have at least one hMetric
  if (num_hmetrics < 1) {
    return FONT_COMPRESSION_FAILURE();
  }

  int num_glyphs = NumGlyphs(*font);

  // Most fonts can be transformed; assume it's a go until proven otherwise
  std::vector<uint16_t> advance_widths;
  std::vector<int16_t> proportional_lsbs;
  std::vector<int16_t> monospace_lsbs;

  bool remove_proportional_lsb = true;
  bool remove_monospace_lsb = (num_glyphs - num_hmetrics) > 0;

  Buffer hmtx_buf(hmtx_table->data, hmtx_table->length);
  for (int i = 0; i < num_glyphs; i++) {
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }

    uint16_t advance_width = 0;
    int16_t lsb = 0;

    if (i < num_hmetrics) {
      // [0, num_hmetrics) are proportional hMetrics
      if (!hmtx_buf.ReadU16(&advance_width)) {
        return FONT_COMPRESSION_FAILURE();
      }

      if (!hmtx_buf.ReadS16(&lsb)) {
        return FONT_COMPRESSION_FAILURE();
      }

      if (glyph_size > 0 && glyph.x_min != lsb) {
        remove_proportional_lsb = false;
      }

      advance_widths.push_back(advance_width);
      proportional_lsbs.push_back(lsb);
    } else {
      // [num_hmetrics, num_glyphs) are monospace leftSideBearing's
      if (!hmtx_buf.ReadS16(&lsb)) {
        return FONT_COMPRESSION_FAILURE();
      }
      if (glyph_size > 0 && glyph.x_min != lsb) {
        remove_monospace_lsb = false;
      }
      monospace_lsbs.push_back(lsb);
    }

    // If we know we can't optimize, bail out completely
    if (!remove_proportional_lsb && !remove_monospace_lsb) {
      return true;
    }
  }

  Font::Table* transformed_hmtx = &font->tables[kHmtxTableTag ^ 0x80808080];

  uint8_t flags = 0;
  size_t transformed_size = 1 + 2 * advance_widths.size();
  if (remove_proportional_lsb) {
    flags |= 1;
  } else {
    transformed_size += 2 * proportional_lsbs.size();
  }
  if (remove_monospace_lsb) {
    flags |= 1 << 1;
  } else {
    transformed_size += 2 * monospace_lsbs.size();
  }

  transformed_hmtx->buffer.reserve(transformed_size);
  std::vector<uint8_t>* out = &transformed_hmtx->buffer;
  WriteBytes(out, &flags, 1);
  for (uint16_t advance_width : advance_widths) {
    WriteUShort(out, advance_width);
  }

  if (!remove_proportional_lsb) {
    for (int16_t lsb : proportional_lsbs) {
      WriteUShort(out, lsb);
    }
  }
  if (!remove_monospace_lsb) {
    for (int16_t lsb : monospace_lsbs) {
      WriteUShort(out, lsb);
    }
  }

  transformed_hmtx->tag = kHmtxTableTag ^ 0x80808080;
  transformed_hmtx->flag_byte = 1 << 6;
  transformed_hmtx->length = transformed_hmtx->buffer.size();
  transformed_hmtx->data = transformed_hmtx->buffer.data();


  return true;
}